

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_5;
  EventTriggerStatementSyntax *pEVar1;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_50;
  DeepCloneVisitor visitor_1;
  SyntaxNode *local_38;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_50 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_50 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_38 = (SyntaxNode *)0x0;
  }
  else {
    local_38 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),&visitor_1,(BumpAllocator *)__child_stack);
  }
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax*,slang::syntax::NameSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_50,args_2,
                      (Token *)&visitor,(TimingControlSyntax **)&local_38,(NameSyntax *)args_5,
                      (Token *)&visitor_1);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EventTriggerStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EventTriggerStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.trigger.deepClone(alloc),
        node.timing ? deepClone(*node.timing, alloc) : nullptr,
        *deepClone<NameSyntax>(*node.name, alloc),
        node.semi.deepClone(alloc)
    );
}